

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Modulus_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  double value;
  double remainder;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  bVar1 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar1) {
    aLeft_local = TaggedInt::Modulus(aLeft,aRight,scriptContext);
  }
  else {
    value = Modulus_Helper(aLeft,aRight,scriptContext);
    aLeft_local = JavascriptNumber::ToVarIntCheck(value,scriptContext);
  }
  return aLeft_local;
}

Assistant:

Var JavascriptMath::Modulus_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Modulus_Full);
            // If both arguments are TaggedInt, then try to do integer modulus.
            // This case is not handled by the lowerer.
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::Modulus(aLeft, aRight, scriptContext);
            }

            double remainder = Modulus_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(remainder, scriptContext);
            JIT_HELPER_END(Op_Modulus_Full);
        }